

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.c
# Opt level: O1

void test_init(void)

{
  uint __line;
  char *__assertion;
  long local_30;
  queue_t queue;
  
  fwrite("test_init() started\n",0x14,1,_stderr);
  queue_init(&local_30);
  if ((int)queue.tail == 0) {
    if (local_30 == 0) {
      if (queue.head == (qnode_t *)0x0) {
        fwrite("test_init() succeed\n",0x14,1,_stderr);
        return;
      }
      __assertion = "NULL == queue.tail";
      __line = 0x22;
    }
    else {
      __assertion = "NULL == queue.head";
      __line = 0x21;
    }
  }
  else {
    __assertion = "0 == queue.len";
    __line = 0x20;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                ,__line,"void test_init()");
}

Assistant:

void test_init()
{
    fprintf(stderr, "test_init() started\n");

    queue_t queue;

    queue_init(&queue);

    assert(0 == queue.len);
    assert(NULL == queue.head);
    assert(NULL == queue.tail);

    fprintf(stderr, "test_init() succeed\n");
}